

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  char *pcVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  ValueHolder VVar7;
  bool bVar8;
  long lVar9;
  bool bVar10;
  long *plVar11;
  long *plVar12;
  ulong uVar13;
  size_type *psVar14;
  ushort uVar15;
  ulong uVar16;
  byte *pbVar17;
  ushort uVar18;
  ValueHolder *this_00;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong local_f0;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  ValueHolder local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ValueHolder local_80 [5];
  ValueHolder local_58 [5];
  
  pcVar4 = token->start_;
  if (pcVar4 == token->end_) {
    bVar10 = false;
  }
  else {
    lVar20 = 0;
    bVar8 = false;
    do {
      bVar10 = true;
      if (!bVar8) {
        uVar19 = (byte)pcVar4[lVar20] - 0x2b;
        if (uVar19 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
            if ((ulong)uVar19 != 2) goto LAB_0010e22c;
            bVar10 = lVar20 != 0;
          }
        }
        else {
LAB_0010e22c:
          bVar10 = false;
        }
      }
      lVar9 = lVar20 + 1;
      lVar20 = lVar20 + 1;
      bVar8 = bVar10;
    } while (pcVar4 + lVar9 != token->end_);
  }
  if (bVar10) {
    bVar10 = decodeDouble(this,token,decoded);
    return bVar10;
  }
  cVar1 = *pcVar4;
  uVar21 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar17 = (byte *)(pcVar4 + (cVar1 == '-'));
  local_f0 = uVar21 / 10;
  bVar10 = false;
  uVar16 = 0;
  while (pbVar17 < token->end_) {
    bVar2 = *pbVar17;
    pbVar17 = pbVar17 + 1;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x119568);
      local_110 = &local_100;
      plVar12 = plVar11 + 2;
      if ((long *)*plVar11 == plVar12) {
        local_100 = *plVar12;
        lStack_f8 = plVar11[3];
      }
      else {
        local_100 = *plVar12;
        local_110 = (long *)*plVar11;
      }
      local_108 = plVar11[1];
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_e8.field_2._M_allocated_capacity = *psVar14;
        local_e8.field_2._8_8_ = plVar11[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar14;
        local_e8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_e8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      addError(this,&local_e8,token,(Location)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0]);
      }
      bVar8 = false;
      bVar10 = false;
    }
    else {
      uVar13 = (ulong)(bVar2 - 0x30);
      if ((uVar16 < local_f0) ||
         (((uVar16 <= local_f0 && (pbVar17 == (byte *)token->end_)) && (uVar13 <= uVar21 % 10)))) {
        uVar16 = uVar13 + uVar16 * 10;
        bVar8 = true;
      }
      else {
        bVar10 = decodeDouble(this,token,decoded);
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return bVar10;
    }
  }
  if (cVar1 == '-') {
    uVar16 = -uVar16;
    this_00 = local_58;
  }
  else {
    if (0x7fffffff < uVar16) {
      this_00 = &local_a8;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uVar3 = *(ushort *)&decoded->field_0x8;
      *(ushort *)&decoded->field_0x8 = uVar3 & 0xff00 | 2;
      uVar15 = uVar3 & 0xff | (ushort)local_a0 & 0xfe00;
      local_a0 = CONCAT22((short)((uint)local_a0 >> 0x10),uVar15);
      local_a8 = decoded->value_;
      (decoded->value_).uint_ = uVar16;
      uVar18 = uVar3 & 0xfe00 | 2;
      goto LAB_0010e516;
    }
    this_00 = local_80;
  }
  uVar15 = (ushort)*(undefined4 *)(this_00 + 1) & 0xfe00;
  *(ushort *)(this_00 + 1) = uVar15 + 1;
  this_00[2].int_ = 0;
  this_00[3].int_ = 0;
  this_00[4].int_ = 0;
  this_00->int_ = uVar16;
  uVar3 = *(ushort *)&decoded->field_0x8;
  uVar18 = (uVar3 & 0xff00) + 1;
  *(ushort *)&decoded->field_0x8 = uVar18;
  uVar15 = uVar3 & 0xff | uVar15;
  *(ushort *)(this_00 + 1) = uVar15;
  VVar5 = decoded->value_;
  (decoded->value_).int_ = uVar16;
  *this_00 = VVar5;
  uVar18 = uVar18 & 0xfe01;
LAB_0010e516:
  *(ushort *)&decoded->field_0x8 = uVar18;
  *(ushort *)(this_00 + 1) = uVar3 & 0x100 | uVar15;
  VVar5 = (ValueHolder)decoded->start_;
  VVar6 = (ValueHolder)decoded->limit_;
  VVar7 = this_00[4];
  decoded->start_ = (size_t)this_00[3];
  decoded->limit_ = (size_t)VVar7;
  this_00[3] = VVar5;
  this_00[4] = VVar6;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}